

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O2

aiTexture * __thiscall aiScene::GetEmbeddedTexture(aiScene *this,char *filename)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  char *__s1;
  long lVar3;
  uint i;
  ulong uVar4;
  
  if (*filename == '*') {
    uVar1 = atoi(filename + 1);
    if ((int)uVar1 < 0) {
      return (aiTexture *)0x0;
    }
    if (this->mNumTextures <= uVar1) {
      return (aiTexture *)0x0;
    }
    lVar3 = (ulong)uVar1 << 3;
  }
  else {
    __s2 = GetShortFilename(filename);
    lVar3 = -8;
    uVar4 = 0;
    do {
      if (this->mNumTextures <= uVar4) {
        return (aiTexture *)0x0;
      }
      __s1 = GetShortFilename((char *)(*(long *)((long)this->mTextures + lVar3 + 8) + 0x24));
      iVar2 = strcmp(__s1,__s2);
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 8;
    } while (iVar2 != 0);
  }
  return *(aiTexture **)(lVar3 + (long)this->mTextures);
}

Assistant:

const aiTexture* GetEmbeddedTexture(const char* filename) const {
        // lookup using texture ID (if referenced like: "*1", "*2", etc.)
        if ('*' == *filename) {
            int index = std::atoi(filename + 1);
            if (0 > index || mNumTextures <= static_cast<unsigned>(index))
                return nullptr;
            return mTextures[index];
        }
        // lookup using filename
        const char* shortFilename = GetShortFilename(filename);
        for (unsigned int i = 0; i < mNumTextures; i++) {
            const char* shortTextureFilename = GetShortFilename(mTextures[i]->mFilename.C_Str());
            if (strcmp(shortTextureFilename, shortFilename) == 0) {
                return mTextures[i];
            }
        }
        return nullptr;
    }